

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O1

bool sptk::WriteStream<float>
               (int write_point,int write_size,
               vector<float,_std::allocator<float>_> *sequence_to_write,ostream *output_stream,
               int *actual_write_size)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  if (output_stream == (ostream *)0x0 || (write_size < 1 || write_point < 0)) {
    bVar3 = false;
  }
  else {
    bVar3 = false;
    iVar1 = 0;
    if ((ulong)(uint)(write_size + write_point) <=
        (ulong)(*(long *)(sequence_to_write + 8) - *(long *)sequence_to_write >> 2)) {
      if (actual_write_size != (int *)0x0) {
        iVar1 = std::ostream::tellp();
      }
      std::ostream::write((char *)output_stream,
                          (ulong)(uint)write_point * 4 + *(long *)sequence_to_write);
      if (actual_write_size != (int *)0x0) {
        iVar2 = std::ostream::tellp();
        iVar2 = iVar2 - iVar1;
        iVar1 = iVar2 + 3;
        if (-1 < iVar2) {
          iVar1 = iVar2;
        }
        *actual_write_size = iVar1 >> 2;
      }
      bVar3 = ((byte)output_stream[*(long *)(*(long *)output_stream + -0x18) + 0x20] & 5) == 0;
    }
  }
  return bVar3;
}

Assistant:

bool WriteStream(int write_point, int write_size,
                 const std::vector<T>& sequence_to_write,
                 std::ostream* output_stream, int* actual_write_size) {
  if (write_point < 0 || write_size <= 0 || NULL == output_stream) {
    return false;
  }

  const int end(write_point + write_size);
  if (sequence_to_write.size() < static_cast<std::size_t>(end)) {
    return false;
  }

  const int before((NULL == actual_write_size)
                       ? 0
                       : static_cast<int>(output_stream->tellp()));

  output_stream->write(
      reinterpret_cast<const char*>(&(sequence_to_write[0]) + write_point),
      sizeof(sequence_to_write[0]) * write_size);

  // When output_stream is cout, actual_write_size is always zero.
  if (NULL != actual_write_size) {
    const int after(static_cast<int>(output_stream->tellp()));
    const int type_byte(sizeof(sequence_to_write[0]));
    *actual_write_size = (after - before) / type_byte;
  }

  return !output_stream->fail();
}